

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O2

bool __thiscall ON_Hatch::IsValid(ON_Hatch *this,ON_TextLog *text_log)

{
  uint uVar1;
  ON_HatchLoop *this_00;
  bool bVar2;
  bool bVar3;
  char *format;
  ulong uVar4;
  ulong uVar5;
  
  bVar2 = ON_Plane::IsValid(&this->m_plane);
  if (bVar2) {
    uVar1 = (this->m_loops).m_count;
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    bVar2 = true;
    bVar3 = true;
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      this_00 = (this->m_loops).m_a[uVar5];
      if (this_00 == (ON_HatchLoop *)0x0) {
        if (text_log != (ON_TextLog *)0x0) {
          format = "Loop[%d] is nullptr\n";
LAB_004b5c17:
          ON_TextLog::Print(text_log,format,uVar5 & 0xffffffff);
          return false;
        }
        goto LAB_004b5c28;
      }
      if (bVar3 != false) {
        bVar3 = ON_HatchLoop::IsValid(this_00,text_log);
      }
      if (bVar3 == false) {
        if (text_log != (ON_TextLog *)0x0) {
          format = "Loop[%d] is not valid\n";
          goto LAB_004b5c17;
        }
        goto LAB_004b5c28;
      }
    }
  }
  else if (text_log == (ON_TextLog *)0x0) {
LAB_004b5c28:
    bVar2 = false;
  }
  else {
    bVar2 = false;
    ON_TextLog::Print(text_log,"Plane is not valid\n");
  }
  return bVar2;
}

Assistant:

bool ON_Hatch::IsValid( ON_TextLog* text_log) const
{
  bool rc = m_plane.IsValid();
  if( !rc)
  {
    if( text_log)
      text_log->Print( "Plane is not valid\n");
    return false;
  }
  // 18 June 2012 - Lowell - Added loop self-intersection and 
  // intersecting other loops tests
  int count = m_loops.Count();
  for(int i = 0; i < count; i++)
  {
    if(m_loops[i] == 0)
    {
      if( text_log)
        text_log->Print( "Loop[%d] is nullptr\n", i);
      return false;
    }
    if(rc)
      rc = m_loops[i]->IsValid( text_log);
    if( !rc)
    {
      if( text_log)
        text_log->Print( "Loop[%d] is not valid\n", i);
      return false;
    }
  }
  

  return true;
}